

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

void anon_unknown.dwarf_bbf46::append_rewrite_rule(RewriteRules *r,char *str)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ostream *poVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  string tmp;
  char *col [3];
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  char *local_38 [3];
  
  sVar4 = strlen(str);
  pcVar5 = str + sVar4;
  ppcVar7 = local_38;
  uVar11 = 0;
  pcVar8 = str;
  do {
    pcVar2 = pcVar5;
    pcVar3 = pcVar8;
    if (2 < uVar11) break;
    for (; pcVar9 = pcVar5, pcVar3 != pcVar5; pcVar3 = pcVar3 + 1) {
      if (*pcVar3 != ' ') {
        lVar10 = 0;
        do {
          bVar12 = lVar10 == 1;
          pcVar9 = pcVar2;
          if (bVar12) goto LAB_0011ed08;
          lVar1 = lVar10 + 1;
          lVar10 = lVar10 + 1;
        } while (*pcVar3 != " \t"[lVar1]);
      }
      bVar12 = false;
      pcVar9 = pcVar3;
LAB_0011ed08:
      if (!bVar12) break;
      pcVar2 = pcVar9;
    }
    *pcVar9 = '\0';
    if (*pcVar8 != '\0') {
      *ppcVar7 = pcVar8;
      ppcVar7 = ppcVar7 + 1;
      uVar11 = uVar11 + 1;
    }
    pcVar8 = pcVar9 + 1;
  } while (pcVar9 != pcVar5);
  if (uVar11 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"n >= 2",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"format error: ",0xe);
    if (str == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar4 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,str,sVar4);
    }
    MeCab::die::~die((die *)&local_58);
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
            (&r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>,
             ((long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>)
                    .
                    super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>)
                    .
                    super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + 1);
  local_50 = 0;
  local_48[0] = '\0';
  local_58 = local_48;
  if (2 < uVar11) {
    strlen(local_38[1]);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38[1]);
    std::__cxx11::string::push_back((char)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    local_38[1] = local_58;
  }
  MeCab::RewritePattern::set_pattern
            ((r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>).
             super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1,local_38[0],local_38[1]);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void append_rewrite_rule(RewriteRules *r, char* str) {
  char *col[3];
  const size_t n = tokenize2(str, " \t", col, 3);
  CHECK_DIE(n >= 2) << "format error: " << str;
  r->resize(r->size() + 1);
  std::string tmp;
  if (n >= 3) {
    tmp = col[1];
    tmp += ' ';
    tmp += col[2];
    col[1] = const_cast<char *>(tmp.c_str());
  }
  r->back().set_pattern(col[0], col[1]);
}